

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall
dlib::message_box_helper::blocking_box_win::blocking_box_win
          (blocking_box_win *this,wstring *title_,wstring *message_)

{
  drawable_window::drawable_window(&this->super_drawable_window,false,false);
  (this->super_drawable_window).super_base_window._vptr_base_window =
       (_func_int **)&PTR__blocking_box_win_003364f8;
  std::__cxx11::wstring::wstring((wstring *)&this->title,(wstring *)title_);
  std::__cxx11::wstring::wstring((wstring *)&this->message,(wstring *)message_);
  label::label(&this->msg,&this->super_drawable_window);
  button::button(&this->btn_ok,&this->super_drawable_window);
  initialize(this);
  return;
}

Assistant:

blocking_box_win::
        blocking_box_win (
            const std::wstring& title_,
            const std::wstring& message_
        ) : 
            drawable_window(false),
            title(title_),
            message(message_),
            msg(*this),
            btn_ok(*this)
        {
            initialize();
        }